

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_flip_vertical_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  ulong __n;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  bool bVar11;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    iVar2 = rf_pixel_buffer_size(image.width,image.height,image.format);
    if (iVar2 <= dst_size) {
      lVar7 = (long)image.width;
      uVar3 = rf_bytes_per_pixel(image.format);
      __n = (ulong)uVar3;
      uVar6 = 0;
      lVar4 = 0;
      if (0 < lVar7) {
        lVar4 = lVar7;
      }
      uVar3 = image.height;
      if (image.height < 1) {
        uVar3 = 0;
      }
      lVar7 = lVar7 * __n;
      pvVar5 = (void *)((image.height + -1) * lVar7 + (long)image.data);
      pvVar10 = dst;
      for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
        lVar9 = 0;
        lVar8 = lVar4;
        while (bVar11 = lVar8 != 0, lVar8 = lVar8 + -1, bVar11) {
          memcpy((void *)((long)pvVar10 + lVar9),(void *)((long)pvVar5 + lVar9),__n);
          lVar9 = lVar9 + __n;
        }
        pvVar10 = (void *)((long)pvVar10 + lVar7);
        pvVar5 = (void *)((long)pvVar5 - lVar7);
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = (int)image._8_8_;
      __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      __return_storage_ptr__->format = (int)uVar1;
      __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_flip_vertical_to_buffer(rf_image image, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    void* dst_pixel = ((unsigned char*)dst) + (y * image.width + x) * bpp;
                    void* src_pixel = ((unsigned char*)image.data) + ((image.height - 1 - y) * image.width + x) * bpp;

                    memcpy(dst_pixel, src_pixel, bpp);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}